

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleNamespace.cpp
# Opt level: O0

BOOL __thiscall
Js::ModuleNamespace::DeleteProperty
          (ModuleNamespace *this,JavascriptString *propertyNameString,PropertyOperationFlags flags)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  PropertyRecord *local_30;
  PropertyRecord *propertyRecord;
  JavascriptString *pJStack_20;
  PropertyOperationFlags flags_local;
  JavascriptString *propertyNameString_local;
  ModuleNamespace *this_local;
  
  local_30 = (PropertyRecord *)0x0;
  propertyRecord._4_4_ = flags;
  pJStack_20 = propertyNameString;
  propertyNameString_local = (JavascriptString *)this;
  bVar2 = Js::JavascriptOperators::ShouldTryDeleteProperty
                    ((RecyclableObject *)this,propertyNameString,&local_30);
  if (bVar2) {
    if (local_30 == (PropertyRecord *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ModuleNamespace.cpp"
                                  ,0x150,"(propertyRecord)","propertyRecord");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    uVar3 = PropertyRecord::GetPropertyId(local_30);
    this_local._4_4_ =
         (*(this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
           super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x21])
                   (this,(ulong)uVar3,(ulong)propertyRecord._4_4_);
  }
  else {
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

BOOL ModuleNamespace::DeleteProperty(JavascriptString *propertyNameString, PropertyOperationFlags flags)
    {
        //Assert: IsPropertyKey(P) is true.
        //Let exports be O.[[Exports]].
        //If P is an element of exports, return false.
        //Return true.
        PropertyRecord const *propertyRecord = nullptr;
        if (JavascriptOperators::ShouldTryDeleteProperty(this, propertyNameString, &propertyRecord))
        {
            Assert(propertyRecord);
            return DeleteProperty(propertyRecord->GetPropertyId(), flags);
        }

        return TRUE;
    }